

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O1

void __thiscall comp_options::print(comp_options *this)

{
  printf("Comp level: %u\n",(ulong)this->m_comp_level);
  printf("Dict size: %i (%u bytes)\n",(ulong)(uint)this->m_dict_size_log2,
         (ulong)(uint)(1 << ((byte)this->m_dict_size_log2 & 0x1f)));
  printf("Compute adler32 during decompression: %u\n",(ulong)this->m_compute_adler32_during_decomp);
  printf("Max helper threads: %i\n",(ulong)(uint)this->m_max_helper_threads);
  printf("Unbuffered decompression: %u\n",(ulong)this->m_unbuffered_decompression);
  printf("Verify compressed data: %u\n",(ulong)this->m_verify_compressed_data);
  printf("Force Polar codes: %u\n",(ulong)this->m_force_polar_codes);
  printf("Extreme parsing: %u\n",(ulong)this->m_extreme_parsing);
  printf("Randomize parameters: %u\n",(ulong)this->m_randomize_params);
  printf("Deterministic parsing: %u\n",(ulong)this->m_deterministic_parsing);
  return;
}

Assistant:

void print()
   {
      printf("Comp level: %u\n", m_comp_level);
      printf("Dict size: %i (%u bytes)\n", m_dict_size_log2, 1 << m_dict_size_log2);
      printf("Compute adler32 during decompression: %u\n", (uint)m_compute_adler32_during_decomp);
      printf("Max helper threads: %i\n", m_max_helper_threads);
      printf("Unbuffered decompression: %u\n", (uint)m_unbuffered_decompression);
      printf("Verify compressed data: %u\n", (uint)m_verify_compressed_data);
      printf("Force Polar codes: %u\n", (uint)m_force_polar_codes);
      printf("Extreme parsing: %u\n", (uint)m_extreme_parsing);
      printf("Randomize parameters: %u\n", m_randomize_params);
      printf("Deterministic parsing: %u\n", m_deterministic_parsing);
   }